

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

void opus_ifft_c(kiss_fft_state *st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  int local_24;
  int i;
  kiss_fft_cpx *fout_local;
  kiss_fft_cpx *fin_local;
  kiss_fft_state *st_local;
  
  for (local_24 = 0; local_24 < st->nfft; local_24 = local_24 + 1) {
    fout[st->bitrev[local_24]] = fin[local_24];
  }
  for (local_24 = 0; local_24 < st->nfft; local_24 = local_24 + 1) {
    fout[local_24].i = -fout[local_24].i;
  }
  opus_fft_impl(st,fout);
  for (local_24 = 0; local_24 < st->nfft; local_24 = local_24 + 1) {
    fout[local_24].i = -fout[local_24].i;
  }
  return;
}

Assistant:

void opus_ifft_c(const kiss_fft_state *st, const kiss_fft_cpx *fin, kiss_fft_cpx *fout) {
    int i;
    celt_assert2 (fin != fout, "In-place FFT not supported");
    /* Bit-reverse the input */
    for (i = 0; i < st->nfft; i++)
        fout[st->bitrev[i]] = fin[i];
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
    opus_fft_impl(st, fout);
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
}